

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

void lyb_read(uint8_t *buf,size_t count,lylyb_ctx *lybctx)

{
  lyd_lyb_sibling *plVar1;
  lyd_lyb_sibling *plVar2;
  ulong uVar3;
  ulong uVar4;
  lyd_lyb_sibling *sib;
  ulong count_00;
  
  if (lybctx == (lylyb_ctx *)0x0) {
    __assert_fail("lybctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0x76,"void lyb_read(uint8_t *, size_t, struct lylyb_ctx *)");
  }
  while( true ) {
    plVar1 = lybctx->siblings;
    uVar3 = 0;
    sib = (lyd_lyb_sibling *)0x0;
    plVar2 = plVar1;
    count_00 = count;
    while( true ) {
      if (plVar1 == (lyd_lyb_sibling *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)&plVar1[-1].inner_chunks;
      }
      if (uVar4 <= uVar3) break;
      if ((plVar2->written <= count_00) && (plVar2->position != 0)) {
        sib = plVar2;
        count_00 = plVar2->written;
      }
      uVar3 = uVar3 + 1;
      plVar2 = plVar2 + 1;
    }
    if ((sib == (lyd_lyb_sibling *)0x0) && (count == 0)) break;
    if (count_00 != 0) {
      if (buf == (uint8_t *)0x0) {
        ly_in_skip(lybctx->in,count_00);
      }
      else {
        ly_in_read(lybctx->in,buf,count_00);
      }
      plVar1 = lybctx->siblings;
      uVar3 = 0xffffffffffffffff;
      plVar2 = plVar1;
      while( true ) {
        if (plVar1 == (lyd_lyb_sibling *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ulong *)&plVar1[-1].inner_chunks;
        }
        uVar3 = uVar3 + 1;
        if (uVar4 <= uVar3) break;
        uVar4 = plVar2->written - count_00;
        plVar2->written = uVar4;
        plVar2 = plVar2 + 1;
        if (0xffff < uVar4) {
          __assert_fail("lybctx->siblings[u].written <= LYB_SIZE_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        ,0x95,"void lyb_read(uint8_t *, size_t, struct lylyb_ctx *)");
        }
      }
      count = count - count_00;
      if (buf != (uint8_t *)0x0) {
        buf = buf + count_00;
      }
    }
    if (sib != (lyd_lyb_sibling *)0x0) {
      lyb_read_sibling_meta(sib,lybctx);
    }
  }
  return;
}

Assistant:

static void
lyb_read(uint8_t *buf, size_t count, struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyd_lyb_sibling *empty;
    size_t to_read;

    assert(lybctx);

    while (1) {
        /* check for fully-read (empty) data chunks */
        to_read = count;
        empty = NULL;
        LY_ARRAY_FOR(lybctx->siblings, u) {
            /* we want the innermost chunks resolved first, so replace previous empty chunks,
             * also ignore chunks that are completely finished, there is nothing for us to do */
            if ((lybctx->siblings[u].written <= to_read) && lybctx->siblings[u].position) {
                /* empty chunk, do not read more */
                to_read = lybctx->siblings[u].written;
                empty = &lybctx->siblings[u];
            }
        }

        if (!empty && !count) {
            break;
        }

        /* we are actually reading some data, not just finishing another chunk */
        if (to_read) {
            if (buf) {
                ly_in_read(lybctx->in, buf, to_read);
            } else {
                ly_in_skip(lybctx->in, to_read);
            }

            LY_ARRAY_FOR(lybctx->siblings, u) {
                /* decrease all written counters */
                lybctx->siblings[u].written -= to_read;
                assert(lybctx->siblings[u].written <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_read;
            if (buf) {
                buf += to_read;
            }
        }

        if (empty) {
            /* read the next chunk meta information */
            lyb_read_sibling_meta(empty, lybctx);
        }
    }
}